

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O2

void libcmepoll_LTX_add_select
               (CMtrans_services_conflict svc,select_data_ptr *sdp,int fd,select_list_func func,
               void *arg1,void *arg2)

{
  undefined8 *puVar1;
  uint uVar2;
  select_data_ptr sd;
  FunctionListElement *pFVar3;
  int iVar4;
  FunctionListElement *pFVar5;
  uint *puVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  uint32_t local_3c;
  int local_38;
  undefined4 local_34;
  
  sd = *sdp;
  if ((sd->cm != (CManager)0x0) &&
     (iVar4 = (*svc->return_CM_lock_status)
                        (sd->cm,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                         ,0x1d8), iVar4 == 0)) {
    printf("%s:%u: failed assertion `%s\'\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
           ,0x1d8,"CM_LOCKED(svc, sd->cm)");
    abort();
  }
  sd->select_consistency_number = sd->select_consistency_number + 1;
  lVar10 = (long)fd;
  if (sd->sel_item_max < fd) {
    sVar8 = (size_t)(fd * 0x18 + 0x18);
    pFVar5 = (FunctionListElement *)(*svc->realloc_func)(sd->write_items,sVar8);
    sd->write_items = pFVar5;
    pFVar5 = (FunctionListElement *)(*svc->realloc_func)(sd->select_items,sVar8);
    sd->select_items = pFVar5;
    if ((pFVar5 == (FunctionListElement *)0x0) ||
       (pFVar3 = sd->write_items, pFVar3 == (FunctionListElement *)0x0)) {
      perror("Realloc failed\n");
      exit(1);
    }
    lVar7 = (long)sd->sel_item_max;
    lVar9 = lVar7 * 0x18;
    for (; lVar7 < lVar10; lVar7 = lVar7 + 1) {
      puVar1 = (undefined8 *)((long)&pFVar3[1].func + lVar9);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pFVar3[1].arg2 + lVar9) = 0;
      puVar1 = (undefined8 *)((long)&pFVar5[1].func + lVar9);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pFVar5[1].arg2 + lVar9) = 0;
      lVar9 = lVar9 + 0x18;
    }
    sd->sel_item_max = fd;
  }
  local_34 = 0;
  local_3c = 1;
  local_38 = fd;
  iVar4 = epoll_ctl(sd->epfd,1,fd,(epoll_event *)&local_3c);
  if (iVar4 < 0) {
    puVar6 = (uint *)__errno_location();
    uVar2 = *puVar6;
    if (uVar2 == 0x11) {
      local_3c = 5;
      iVar4 = epoll_ctl(sd->epfd,3,fd,(epoll_event *)&local_3c);
      if (-1 < iVar4) goto LAB_00101352;
      uVar2 = *puVar6;
    }
    fprintf(_stderr,"Something bad in %s. %d\n","libcmepoll_LTX_add_select",(ulong)uVar2);
  }
LAB_00101352:
  (*svc->verbose)(sd->cm,CMSelectVerbose,"Adding fd %d to select read list",(ulong)(uint)fd);
  pFVar5 = sd->select_items;
  pFVar5[lVar10].func = func;
  pFVar5[lVar10].arg1 = arg1;
  pFVar5[lVar10].arg2 = arg2;
  wake_server_thread(sd);
  return;
}

Assistant:

extern void
libcmepoll_LTX_add_select(CMtrans_services svc, select_data_ptr *sdp, int fd, select_list_func func, void *arg1, void *arg2)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    struct epoll_event ep_event;

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }
    sd->select_consistency_number++;
    if (fd > sd->sel_item_max) {
	int i;
	int size = (fd+1)*sizeof(sd->select_items[0]);
	sd->write_items = 
	    (FunctionListElement *) svc->realloc_func(sd->write_items, size);
	sd->select_items = 
	    (FunctionListElement *) svc->realloc_func(sd->select_items, size);
	if ((sd->select_items == NULL) || (sd->write_items == NULL)) {
	    perror("Realloc failed\n");
	    exit(1);
	}

	for (i = sd->sel_item_max + 1; i <= fd; i++) {
	    sd->write_items[i].func = NULL;
	    sd->write_items[i].arg1 = NULL;
	    sd->write_items[i].arg2 = NULL;
	    sd->select_items[i].func = NULL;
	    sd->select_items[i].arg1 = NULL;
	    sd->select_items[i].arg2 = NULL;
	}
	sd->sel_item_max = fd;
    }
    memset(&ep_event, 0, sizeof(ep_event));
    ep_event.events = EPOLLIN;
    ep_event.data.fd = fd;
    if(epoll_ctl(sd->epfd, EPOLL_CTL_ADD, fd, &ep_event) < 0) {
    	if(errno == EEXIST) {
    		/* This is fd is already armed for read */
    		ep_event.events = EPOLLIN | EPOLLOUT;
    		if (epoll_ctl(sd->epfd, EPOLL_CTL_MOD, fd, &ep_event) < 0) {
    			fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    		}
    	} else {
    		fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    	}
    }

    svc->verbose(sd->cm, CMSelectVerbose, "Adding fd %d to select read list", fd);
    sd->select_items[fd].func = func;
    sd->select_items[fd].arg1 = arg1;
    sd->select_items[fd].arg2 = arg2;
    wake_server_thread(sd);
}